

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,PatternPtr *underlyingPattern)

{
  element_type *peVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  peVar1 = (underlyingPattern->
           super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__Pattern_0019e230;
  (this->super_Pattern).m_name._M_dataplus._M_p = (pointer)&(this->super_Pattern).m_name.field_2;
  pcVar2 = (peVar1->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Pattern).m_name,pcVar2,
             pcVar2 + (peVar1->m_name)._M_string_length);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__ExcludedPattern_0019e2a8;
  (this->m_underlyingPattern).
  super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (underlyingPattern->super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)
       ._M_ptr;
  p_Var3 = (underlyingPattern->
           super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->m_underlyingPattern).
  super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

TestSpec::ExcludedPattern::ExcludedPattern( PatternPtr const& underlyingPattern )
    : Pattern( underlyingPattern->name() )
    , m_underlyingPattern( underlyingPattern )
    {}